

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseArgumentsCommand.cxx
# Opt level: O3

bool cmParseArgumentsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  _Var7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Var9;
  _Base_ptr p_Var10;
  string *psVar11;
  cmValue __args;
  long *plVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> *pbVar14;
  size_type *psVar15;
  ulong *puVar16;
  const_iterator __begin2;
  pointer pbVar17;
  ulong uVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  unsigned_long uVar23;
  const_iterator __end2;
  ulong uVar24;
  pointer pbVar25;
  string_view arg;
  string_view name;
  string_view name_00;
  string_view name_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_bool>
  pVar26;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar27;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_bool>
  pVar28;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view separator;
  string_view value_03;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string prefix;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keywordsMissingValues;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  unsigned_long count;
  unsigned_long argvStart;
  ostringstream argName;
  UserArgumentParser parser;
  multi_map multiValArgs;
  single_map singleValArgs;
  options_map options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  string local_3c8;
  int local_3a4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  ulong local_340;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  ulong local_320;
  unsigned_long local_318;
  pointer local_310;
  cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_308;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [24];
  size_t local_2c0;
  ios_base local_278 [272];
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  _Manager_type p_Stack_140;
  _Invoker_type local_138;
  _Any_data _Stack_130;
  _Manager_type p_Stack_120;
  _Invoker_type local_118;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  vStack_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  local_90;
  ParseResult local_60;
  
  pbVar25 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar24 = (long)pbVar1 - (long)pbVar25;
  if (uVar24 < 0x61) {
    local_2e8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_2d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2e8,"must be called with at least 4 arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_388.field_2._M_allocated_capacity = local_2d8._0_8_;
    _Var20._M_p = (pointer)local_2e8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8) goto LAB_003abcd7;
  }
  else {
    local_318 = 0;
    local_3a4 = std::__cxx11::string::compare((char *)pbVar25);
    if (local_3a4 == 0) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start != 0xc0) {
        pcVar3 = status->Makefile;
        local_2e8._0_8_ = local_2d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2e8,"PARSE_ARGV must be called with exactly 6 arguments.","");
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_2e8);
        if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        goto LAB_003abcd7;
      }
      bVar6 = cmStrToULong(pbVar25 + 1,&local_318);
      if (!bVar6) {
        pcVar3 = status->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,"PARSE_ARGV index \'",pbVar25 + 1);
        plVar12 = (long *)std::__cxx11::string::append((char *)local_168);
        psVar15 = (size_type *)(plVar12 + 2);
        if ((size_type *)*plVar12 == psVar15) {
          local_2d8._0_8_ = *psVar15;
          local_2d8._8_8_ = plVar12[3];
          local_2e8._0_8_ = local_2d8;
        }
        else {
          local_2d8._0_8_ = *psVar15;
          local_2e8._0_8_ = (size_type *)*plVar12;
        }
        local_2e8._8_8_ = plVar12[1];
        *plVar12 = (long)psVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_2e8);
        if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
          operator_delete((void *)local_2e8._0_8_,local_2d8._0_8_ + 1);
        }
        if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
          operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
        }
        cmSystemTools::s_FatalErrorOccurred = true;
        goto LAB_003abcd7;
      }
      pbVar25 = pbVar25 + 2;
    }
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    pcVar2 = (pbVar25->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,pcVar2,pcVar2 + pbVar25->_M_string_length);
    std::__cxx11::string::append((char *)&local_388);
    vStack_110.
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_110.
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118 = (_Invoker_type)0x0;
    vStack_110.
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Stack_130._8_8_ = 0;
    p_Stack_120 = (_Manager_type)0x0;
    local_138 = (_Invoker_type)0x0;
    _Stack_130._M_unused._M_object = (void *)0x0;
    local_158._16_8_ = 0;
    p_Stack_140 = (_Manager_type)0x0;
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (void *)0x0;
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (pointer)0x0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c0._M_impl.super__Rb_tree_header._M_header;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f0._M_impl.super__Rb_tree_header._M_header;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_338.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arg._M_str = pbVar25[1]._M_dataplus._M_p;
    arg._M_len = pbVar25[1]._M_string_length;
    local_340 = uVar24;
    local_310 = pbVar1;
    local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    cmExpandedList_abi_cxx11_(&local_3a0,arg,false);
    pbVar1 = local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar17 = local_3a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffffffffff00;
        pVar26 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                 ::_M_emplace_unique<std::__cxx11::string_const&,bool>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                             *)&local_90,pbVar17,(bool *)local_2e8);
        _Var7 = pVar26.first._M_node;
        name._M_str = *(char **)(_Var7._M_node + 1);
        name._M_len = (size_t)_Var7._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::Bind<bool>
                          ((cmArgumentParser<void> *)local_168,name,(bool *)(_Var7._M_node + 2));
        if (!bVar6) {
          pcVar3 = status->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,"keyword defined more than once: ",pbVar17);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
          ;
          if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
        }
        pbVar4 = local_3a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar1);
      if (local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar22 = &(local_3a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar22 + -1))->_M_dataplus)._M_p;
          if (paVar22 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar22->_M_allocated_capacity + 1);
          }
          pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar22 + 1);
          paVar22 = paVar22 + 2;
        } while (pbVar21 !=
                 local_3a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
    }
    arg_00._M_str = pbVar25[2]._M_dataplus._M_p;
    arg_00._M_len = pbVar25[2]._M_string_length;
    cmExpandList(arg_00,&local_3a0,false);
    pbVar1 = local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar17 = local_3a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2e8._8_8_ = 0;
        local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffffffffff00;
        local_2e8._0_8_ = local_2d8;
        pVar27 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::_M_emplace_unique<std::__cxx11::string_const&,std::__cxx11::string>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)&local_c0,pbVar17,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2e8);
        _Var8 = pVar27.first._M_node;
        if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
          operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
        }
        name_00._M_str = *(char **)(_Var8._M_node + 1);
        name_00._M_len = (size_t)_Var8._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::Bind<std::__cxx11::string>
                          ((cmArgumentParser<void> *)local_168,name_00,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (_Var8._M_node + 2));
        if (!bVar6) {
          pcVar3 = status->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,"keyword defined more than once: ",pbVar17);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
          ;
          if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
        }
        pbVar5 = local_3a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_3a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar1);
      if (local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar22 = &(local_3a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar22 + -1))->_M_dataplus)._M_p;
          if (paVar22 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar22->_M_allocated_capacity + 1);
          }
          pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar22 + 1);
          paVar22 = paVar22 + 2;
        } while (pbVar21 != pbVar5);
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
      }
    }
    arg_01._M_str = pbVar25[3]._M_dataplus._M_p;
    arg_01._M_len = pbVar25[3]._M_string_length;
    cmExpandList(arg_01,&local_3a0,false);
    pbVar1 = local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar17 = local_3a0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2e8._0_8_ = (pointer)0x0;
        local_2e8._8_8_ = 0;
        local_2d8._0_8_ = (code *)0x0;
        pVar28 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                 ::
                 _M_emplace_unique<std::__cxx11::string_const&,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
                             *)&local_f0,pbVar17,
                            (NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_2e8);
        _Var9 = pVar28.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2e8);
        name_01._M_str = *(char **)(_Var9._M_node + 1);
        name_01._M_len = (size_t)_Var9._M_node[1]._M_parent;
        bVar6 = cmArgumentParser<void>::
                Bind<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((cmArgumentParser<void> *)local_168,name_01,
                           (NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)(_Var9._M_node + 2));
        if (!bVar6) {
          pcVar3 = status->Makefile;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e8,"keyword defined more than once: ",pbVar17);
          cmMakefile::IssueMessage
                    (pcVar3,WARNING,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
          ;
          if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
          }
        }
        pbVar4 = local_3a0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar1);
      if (local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3a0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar22 = &(local_3a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar12 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (paVar22 + -1))->_M_dataplus)._M_p;
          if (paVar22 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            operator_delete(plVar12,paVar22->_M_allocated_capacity + 1);
          }
          pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (paVar22 + 1);
          paVar22 = paVar22 + 2;
        } while (pbVar21 != pbVar4);
        local_3a0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_3a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    pbVar1 = local_310;
    if (local_3a4 == 0) {
      pcVar3 = status->Makefile;
      local_2e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_2d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"ARGC","");
      psVar11 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_2e8);
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      pcVar2 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3e8,pcVar2,pcVar2 + psVar11->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8) {
        operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
      }
      bVar6 = cmStrToULong(&local_3e8,&local_320);
      if (bVar6) {
        if (local_318 < local_320) {
          uVar23 = local_318;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2e8,"ARGV",4);
            std::ostream::_M_insert<unsigned_long>((ulong)local_2e8);
            pcVar3 = status->Makefile;
            std::__cxx11::stringbuf::str();
            __args = cmMakefile::GetDefinition(pcVar3,&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
            if (__args.Value == (string *)0x0) {
              pcVar3 = status->Makefile;
              std::__cxx11::stringbuf::str();
              plVar12 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_308,0,(char *)0x0,0x778c29);
              local_368._M_allocated_capacity = (size_type)&local_358;
              pbVar14 = (basic_string_view<char,_std::char_traits<char>_> *)(plVar12 + 2);
              if ((basic_string_view<char,_std::char_traits<char>_> *)*plVar12 == pbVar14) {
                local_358._M_len = pbVar14->_M_len;
                local_358._M_str = (char *)plVar12[3];
              }
              else {
                local_358._M_len = pbVar14->_M_len;
                local_368._M_allocated_capacity =
                     (size_type)(basic_string_view<char,_std::char_traits<char>_> *)*plVar12;
              }
              local_368._8_8_ = plVar12[1];
              *plVar12 = (long)pbVar14;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              plVar12 = (long *)std::__cxx11::string::append(local_368._M_local_buf);
              local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
              psVar15 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_3c8.field_2._M_allocated_capacity = *psVar15;
                local_3c8.field_2._8_8_ = plVar12[3];
              }
              else {
                local_3c8.field_2._M_allocated_capacity = *psVar15;
                local_3c8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_3c8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_3c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
                operator_delete(local_3c8._M_dataplus._M_p,
                                local_3c8.field_2._M_allocated_capacity + 1);
              }
              if ((basic_string_view<char,_std::char_traits<char>_> *)
                  local_368._M_allocated_capacity != &local_358) {
                operator_delete((void *)local_368._M_allocated_capacity,local_358._M_len + 1);
              }
              if (local_308.Begin._M_node != (_Base_ptr)local_2f8) {
                operator_delete(local_308.Begin._M_node,local_2f8._0_8_ + 1);
              }
              cmSystemTools::s_FatalErrorOccurred = true;
            }
            else {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string_const&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_3a0,__args.Value);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
            std::ios_base::~ios_base(local_278);
            if (__args.Value == (string *)0x0) {
              uVar24 = local_340;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p,
                                local_3e8.field_2._M_allocated_capacity + 1);
                uVar24 = local_340;
              }
              goto LAB_003abc20;
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 < local_320);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003ab38e;
      }
      pcVar3 = status->Makefile;
      std::operator+(&local_3c8,"PARSE_ARGV called with ARGC=\'",&local_3e8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      puVar16 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_2d8._0_8_ = *puVar16;
        local_2d8._8_8_ = plVar12[3];
        local_2e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_2d8;
      }
      else {
        local_2d8._0_8_ = *puVar16;
        local_2e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_2e8._8_8_ = plVar12[1];
      *plVar12 = (long)puVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8) {
        operator_delete((void *)local_2e8._0_8_,(ulong)(local_2d8._0_8_ + 1));
      }
      uVar24 = local_340;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        uVar18 = local_3e8.field_2._M_allocated_capacity + 1;
        uVar19 = local_3e8._M_dataplus._M_p;
        goto LAB_003abc1b;
      }
    }
    else {
      pbVar25 = pbVar25 + 4;
      if (pbVar25 != local_310) {
        do {
          arg_02._M_str = (pbVar25->_M_dataplus)._M_p;
          arg_02._M_len = pbVar25->_M_string_length;
          cmExpandList(arg_02,&local_3a0,false);
          pbVar25 = pbVar25 + 1;
        } while (pbVar25 != pbVar1);
      }
LAB_003ab38e:
      local_2e8._0_8_ = &local_368;
      local_368._M_allocated_capacity = 0;
      local_368._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)0x0;
      local_358._M_len = 0;
      local_2e8._8_8_ = 0;
      local_2d8._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmParseArgumentsCommand.cxx:54:7)>
           ::_M_invoke;
      local_2d8._0_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmParseArgumentsCommand.cxx:54:7)>
           ::_M_manager;
      ArgumentParser::Base::BindKeywordMissingValue
                ((Base *)local_168,(KeywordNameAction *)local_2e8);
      if ((code *)local_2d8._0_8_ != (code *)0x0) {
        (*(code *)local_2d8._0_8_)(local_2e8,local_2e8,3);
      }
      cmArgumentParser<void>::
      Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_60,(cmArgumentParser<void> *)local_168,&local_3a0,&local_338,0);
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
      pcVar3 = status->Makefile;
      std::
      set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::
      set<__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                ((set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_2e8,
                 (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  )local_368._M_allocated_capacity,
                 (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  )local_368._8_8_);
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header) {
        p_Var10 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::operator+(&local_3e8,&local_388,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
          uVar24 = (ulong)(byte)(char)p_Var10[2]._M_color;
          pcVar13 = "FALSE";
          if (uVar24 != 0) {
            pcVar13 = "TRUE";
          }
          value._M_len = uVar24 ^ 5;
          value._M_str = pcVar13;
          cmMakefile::AddDefinition(pcVar3,&local_3e8,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_90._M_impl.super__Rb_tree_header);
      }
      uVar24 = local_340;
      if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_c0._M_impl.super__Rb_tree_header) {
        p_Var10 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (p_Var10[2]._M_parent == (_Base_ptr)0x0) {
            std::operator+(&local_3e8,&local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            cmMakefile::RemoveDefinition(pcVar3,&local_3e8);
          }
          else {
            std::operator+(&local_3e8,&local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            value_00._M_str = *(char **)(p_Var10 + 2);
            value_00._M_len = (size_t)p_Var10[2]._M_parent;
            cmMakefile::AddDefinition(pcVar3,&local_3e8,value_00);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_c0._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_f0._M_impl.super__Rb_tree_header) {
        p_Var10 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          if (*(_Base_ptr *)(p_Var10 + 2) == p_Var10[2]._M_parent) {
            std::operator+(&local_3e8,&local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            cmMakefile::RemoveDefinition(pcVar3,&local_3e8);
          }
          else {
            std::operator+(&local_3e8,&local_388,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1));
            JoinList(&local_3c8,
                     *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       **)(p_Var10 + 2),SUB81(p_Var10[2]._M_parent,0));
            value_01._M_str = local_3c8._M_dataplus._M_p;
            value_01._M_len = local_3c8._M_string_length;
            cmMakefile::AddDefinition(pcVar3,&local_3e8,value_01);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
              operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != &local_f0._M_impl.super__Rb_tree_header);
      }
      if (local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_388._M_dataplus._M_p,
                   local_388._M_dataplus._M_p + local_388._M_string_length);
        std::__cxx11::string::append((char *)&local_3e8);
        cmMakefile::RemoveDefinition(pcVar3,&local_3e8);
      }
      else {
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_388._M_dataplus._M_p,
                   local_388._M_dataplus._M_p + local_388._M_string_length);
        std::__cxx11::string::append((char *)&local_3e8);
        JoinList(&local_3c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 SUB81(local_338.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,0));
        value_02._M_str = local_3c8._M_dataplus._M_p;
        value_02._M_len = local_3c8._M_string_length;
        cmMakefile::AddDefinition(pcVar3,&local_3e8,value_02);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0 == 0) {
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_388._M_dataplus._M_p,
                   local_388._M_dataplus._M_p + local_388._M_string_length);
        std::__cxx11::string::append((char *)&local_3e8);
        cmMakefile::RemoveDefinition(pcVar3,&local_3e8);
      }
      else {
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_388._M_dataplus._M_p,
                   local_388._M_dataplus._M_p + local_388._M_string_length);
        std::__cxx11::string::append((char *)&local_3e8);
        local_308.End._M_node = (_Base_ptr)(local_2e8 + 8);
        local_308.Begin._M_node = (_Base_ptr)local_2d8._8_8_;
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin<cmRange<std::_Rb_tree_const_iterator<std::basic_string_view<char,std::char_traits<char>>>>>
                  (&local_3c8,&local_308,separator);
        value_03._M_str = local_3c8._M_dataplus._M_p;
        value_03._M_len = local_3c8._M_string_length;
        cmMakefile::AddDefinition(pcVar3,&local_3e8,value_03);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_2e8);
      if ((basic_string_view<char,_std::char_traits<char>_> *)local_368._M_allocated_capacity !=
          (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
        uVar18 = local_358._M_len - local_368._0_8_;
        uVar19 = local_368._M_allocated_capacity;
LAB_003abc1b:
        operator_delete((void *)uVar19,uVar18);
      }
    }
LAB_003abc20:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~_Rb_tree(&local_f0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~_Rb_tree(&local_90);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector(&vStack_110);
    if (p_Stack_120 != (_Manager_type)0x0) {
      (*p_Stack_120)((_Any_data *)(local_158 + 0x28),(_Any_data *)(local_158 + 0x28),
                     __destroy_functor);
    }
    if (p_Stack_140 != (_Manager_type)0x0) {
      (*p_Stack_140)((_Any_data *)(local_158 + 8),(_Any_data *)(local_158 + 8),__destroy_functor);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_168);
    _Var20._M_p = local_388._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p == &local_388.field_2) goto LAB_003abcd7;
  }
  operator_delete(_Var20._M_p,(ulong)(local_388.field_2._M_allocated_capacity + 1));
LAB_003abcd7:
  return 0x60 < uVar24;
}

Assistant:

bool cmParseArgumentsCommand(std::vector<std::string> const& args,
                             cmExecutionStatus& status)
{
  // cmake_parse_arguments(prefix options single multi <ARGN>)
  //                         1       2      3      4
  // or
  // cmake_parse_arguments(PARSE_ARGV N prefix options single multi)
  if (args.size() < 4) {
    status.SetError("must be called with at least 4 arguments.");
    return false;
  }

  auto argIter = args.begin();
  auto argEnd = args.end();
  bool parseFromArgV = false;
  unsigned long argvStart = 0;
  if (*argIter == "PARSE_ARGV") {
    if (args.size() != 6) {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        "PARSE_ARGV must be called with exactly 6 arguments.");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    parseFromArgV = true;
    argIter++; // move past PARSE_ARGV
    if (!cmStrToULong(*argIter, &argvStart)) {
      status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                        "PARSE_ARGV index '" + *argIter +
                                          "' is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    argIter++; // move past N
  }
  // the first argument is the prefix
  const std::string prefix = (*argIter++) + "_";

  UserArgumentParser parser;

  // define the result maps holding key/value pairs for
  // options, single values and multi values
  options_map options;
  single_map singleValArgs;
  multi_map multiValArgs;

  // anything else is put into a vector of unparsed strings
  std::vector<std::string> unparsed;

  auto const duplicateKey = [&status](std::string const& key) {
    status.GetMakefile().IssueMessage(
      MessageType::WARNING, "keyword defined more than once: " + key);
  };

  // the second argument is a (cmake) list of options without argument
  std::vector<std::string> list = cmExpandedList(*argIter++);
  parser.Bind(list, options, duplicateKey);

  // the third argument is a (cmake) list of single argument options
  list.clear();
  cmExpandList(*argIter++, list);
  parser.Bind(list, singleValArgs, duplicateKey);

  // the fourth argument is a (cmake) list of multi argument options
  list.clear();
  cmExpandList(*argIter++, list);
  parser.Bind(list, multiValArgs, duplicateKey);

  list.clear();
  if (!parseFromArgV) {
    // Flatten ;-lists in the arguments into a single list as was done
    // by the original function(CMAKE_PARSE_ARGUMENTS).
    for (; argIter != argEnd; ++argIter) {
      cmExpandList(*argIter, list);
    }
  } else {
    // in the PARSE_ARGV move read the arguments from ARGC and ARGV#
    std::string argc = status.GetMakefile().GetSafeDefinition("ARGC");
    unsigned long count;
    if (!cmStrToULong(argc, &count)) {
      status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                        "PARSE_ARGV called with ARGC='" +
                                          argc +
                                          "' that is not an unsigned integer");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    for (unsigned long i = argvStart; i < count; ++i) {
      std::ostringstream argName;
      argName << "ARGV" << i;
      cmValue arg = status.GetMakefile().GetDefinition(argName.str());
      if (!arg) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR,
                                          "PARSE_ARGV called with " +
                                            argName.str() + " not set");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      list.emplace_back(*arg);
    }
  }

  std::vector<cm::string_view> keywordsMissingValues;
  parser.BindKeywordsMissingValue(keywordsMissingValues);

  parser.Parse(list, &unparsed);

  PassParsedArguments(
    prefix, status.GetMakefile(), options, singleValArgs, multiValArgs,
    unparsed,
    options_set(keywordsMissingValues.begin(), keywordsMissingValues.end()),
    parseFromArgV);

  return true;
}